

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.h
# Opt level: O1

void bitset_set_to_value(bitset_t *bitset,size_t i,_Bool flag)

{
  _Bool _Var1;
  undefined3 in_register_00000011;
  ulong uVar2;
  
  uVar2 = i >> 6;
  if ((bitset->arraysize <= uVar2) && (_Var1 = bitset_grow(bitset,uVar2 + 1), !_Var1)) {
    return;
  }
  bitset->array[uVar2] =
       ~(1L << ((byte)i & 0x3f)) & bitset->array[uVar2] |
       (ulong)CONCAT31(in_register_00000011,flag) << ((byte)i & 0x3f);
  return;
}

Assistant:

inline void bitset_set_to_value(bitset_t *bitset, size_t i, bool flag) {
    size_t shiftedi = i / 64;
    uint64_t mask = ((uint64_t)1) << (i % 64);
    uint64_t dynmask = ((uint64_t)flag) << (i % 64);
    if (shiftedi >= bitset->arraysize) {
        if (!bitset_grow(bitset, shiftedi + 1)) {
            return;
        }
    }
    uint64_t w = bitset->array[shiftedi];
    w &= ~mask;
    w |= dynmask;
    bitset->array[shiftedi] = w;
}